

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIListBox::swapItems(CGUIListBox *this,u32 index1,u32 index2)

{
  pointer pLVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pLVar4;
  s32 sVar5;
  bool bVar6;
  undefined3 uVar7;
  uint uVar8;
  pointer pLVar9;
  ListItem dummmy;
  ListItem local_78;
  
  pLVar9 = (this->Items).m_data.
           super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (int)((ulong)((long)(this->Items).m_data.
                              super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar9) >> 3) *
          0x38e38e39;
  if (index2 < uVar8 && index1 < uVar8) {
    pLVar9 = pLVar9 + index1;
    local_78.Text.str._M_dataplus._M_p = (pointer)((long)&local_78 + 0x10);
    local_78.Text.str._M_string_length = 0;
    local_78.Text.str.field_2._M_local_buf[0] = L'\0';
    if (&local_78 != pLVar9) {
      ::std::__cxx11::wstring::_M_assign((wstring *)&local_78);
    }
    local_78.OverrideColors[3].Color.color =
         ((SColor *)((long)(pLVar9->OverrideColors + 3) + 4))->color;
    local_78.Icon = pLVar9->Icon;
    local_78.OverrideColors[0].Use = pLVar9->OverrideColors[0].Use;
    local_78.OverrideColors[0]._1_3_ = *(undefined3 *)&pLVar9->OverrideColors[0].field_0x1;
    local_78.OverrideColors._4_8_ = *(undefined8 *)&pLVar9->OverrideColors[0].Color;
    local_78.OverrideColors._12_8_ = *(undefined8 *)((long)(pLVar9->OverrideColors + 1) + 4);
    local_78.OverrideColors._20_8_ = *(undefined8 *)((long)(pLVar9->OverrideColors + 2) + 4);
    pLVar1 = (this->Items).m_data.
             super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar9 = pLVar1 + index1;
    if (index1 != index2) {
      ::std::__cxx11::wstring::_M_assign((wstring *)pLVar9);
    }
    ((SColor *)((long)(pLVar9->OverrideColors + 3) + 4))->color =
         ((SColor *)((long)(pLVar1[index2].OverrideColors + 3) + 4))->color;
    pLVar4 = pLVar1 + index2;
    sVar5 = pLVar4->Icon;
    bVar6 = pLVar4->OverrideColors[0].Use;
    uVar7 = *(undefined3 *)&pLVar4->OverrideColors[0].field_0x1;
    uVar2 = *(undefined8 *)&pLVar1[index2].OverrideColors[0].Color;
    uVar3 = *(undefined8 *)((long)(pLVar1[index2].OverrideColors + 2) + 4);
    *(undefined8 *)((long)(pLVar9->OverrideColors + 1) + 4) =
         *(undefined8 *)((long)(pLVar1[index2].OverrideColors + 1) + 4);
    *(undefined8 *)((long)(pLVar9->OverrideColors + 2) + 4) = uVar3;
    pLVar9->Icon = sVar5;
    pLVar9->OverrideColors[0].Use = bVar6;
    *(undefined3 *)&pLVar9->OverrideColors[0].field_0x1 = uVar7;
    *(undefined8 *)&pLVar9->OverrideColors[0].Color = uVar2;
    pLVar9 = (this->Items).m_data.
             super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
             ._M_impl.super__Vector_impl_data._M_start + index2;
    if (pLVar9 != &local_78) {
      ::std::__cxx11::wstring::_M_assign((wstring *)pLVar9);
    }
    ((SColor *)((long)(pLVar9->OverrideColors + 3) + 4))->color =
         local_78.OverrideColors[3].Color.color;
    *(undefined8 *)((long)(pLVar9->OverrideColors + 1) + 4) = local_78.OverrideColors._12_8_;
    *(undefined8 *)((long)(pLVar9->OverrideColors + 2) + 4) = local_78.OverrideColors._20_8_;
    pLVar9->Icon = local_78.Icon;
    pLVar9->OverrideColors[0].Use = local_78.OverrideColors[0].Use;
    *(undefined3 *)&pLVar9->OverrideColors[0].field_0x1 = local_78.OverrideColors[0]._1_3_;
    *(undefined8 *)&pLVar9->OverrideColors[0].Color = local_78.OverrideColors._4_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_78.Text.str._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)((long)&local_78 + 0x10U)) {
      operator_delete(local_78.Text.str._M_dataplus._M_p,
                      CONCAT44(local_78.Text.str.field_2._M_local_buf[1],
                               local_78.Text.str.field_2._M_local_buf[0]) * 4 + 4);
    }
  }
  return;
}

Assistant:

void CGUIListBox::swapItems(u32 index1, u32 index2)
{
	if (index1 >= Items.size() || index2 >= Items.size())
		return;

	ListItem dummmy = Items[index1];
	Items[index1] = Items[index2];
	Items[index2] = dummmy;
}